

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkSweepBufsInvs(Abc_Ntk_t *pNtk,int fVerbose)

{
  ulong uVar1;
  Hop_Man_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  Hop_Obj_t *pHVar8;
  Hop_Obj_t *pHVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x3ce,"int Abc_NtkSweepBufsInvs(Abc_Ntk_t *, int)");
  }
  iVar4 = Abc_NtkToAig(pNtk);
  if (iVar4 == 0) {
    fwrite("Converting to SOP has failed.\n",0x1e,1,_stdout);
    uVar5 = 1;
  }
  else {
    p = (Hop_Man_t *)pNtk->pManFunc;
    uVar10 = extraout_RDX;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar4 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar4 + 500;
      iVar11 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar11) {
        piVar6 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar6;
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar11;
        uVar10 = extraout_RDX_00;
      }
      if (-500 < iVar4) {
        memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
        uVar10 = extraout_RDX_01;
      }
      (pNtk->vTravIds).nSize = iVar11;
    }
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (0x3ffffffe < iVar4) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    uVar5 = 0;
    do {
      pVVar7 = pNtk->vObjs;
      if (pVVar7->nSize < 1) {
        bVar3 = true;
      }
      else {
        lVar13 = 0;
        bVar3 = false;
        do {
          pObj = (Abc_Obj_t *)pVVar7->pArray[lVar13];
          if ((pObj != (Abc_Obj_t *)0x0) && (0 < (pObj->vFanins).nSize)) {
            lVar12 = 0;
            do {
              pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
              pAVar2 = pNode->pNtk;
              iVar4 = pNode->Id;
              Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,(int)uVar10);
              if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar10 = extraout_RDX_02;
              if (((((pAVar2->vTravIds).pArray[iVar4] != pNode->pNtk->nTravIds) &&
                   ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) && ((pNode->vFanins).nSize == 1)) &&
                 (((*(uint *)&pObj->field_0x14 & 0xf) - 5 < 0xfffffffe ||
                  (iVar4 = Abc_NodeIsInv(pNode), uVar10 = extraout_RDX_03, iVar4 == 0)))) {
                iVar4 = Abc_NodeIsInv(pNode);
                if (iVar4 != 0) {
                  pHVar9 = (Hop_Obj_t *)(pObj->field_5).pData;
                  pHVar8 = Hop_IthVar(p,(int)lVar12);
                  pHVar9 = Hop_Compose(p,pHVar9,(Hop_Obj_t *)((ulong)pHVar8 ^ 1),(int)lVar12);
                  (pObj->field_5).pData = pHVar9;
                }
                uVar5 = uVar5 + 1;
                Abc_ObjPatchFanin(pObj,pNode,
                                  (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray])
                ;
                bVar3 = true;
                uVar10 = extraout_RDX_04;
                if ((pNode->vFanouts).nSize == 0) {
                  Abc_NtkDeleteObj(pNode);
                  uVar10 = extraout_RDX_05;
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < (pObj->vFanins).nSize);
          }
          lVar13 = lVar13 + 1;
          pVVar7 = pNtk->vObjs;
        } while (lVar13 < pVVar7->nSize);
        bVar3 = !bVar3;
      }
    } while (!bVar3);
    if (fVerbose != 0) {
      printf("Removed %d single input nodes.\n",(ulong)uVar5);
    }
  }
  return uVar5;
}

Assistant:

int Abc_NtkSweepBufsInvs( Abc_Ntk_t * pNtk, int fVerbose )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fChanges = 1, Counter = 0;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 1;
    }
    // get AIG manager
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    // label selected nodes
    Abc_NtkIncrementTravId( pNtk );
    // iterate till no improvement
    while ( fChanges )
    {
        fChanges = 0;
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            Abc_ObjForEachFanin( pObj, pFanin, k )
            {
                // do not eliminate marked fanins
                if ( Abc_NodeIsTravIdCurrent(pFanin) )
                    continue;
                // do not eliminate constant nodes
                if ( !Abc_ObjIsNode(pFanin) || Abc_ObjFaninNum(pFanin) != 1 )
                    continue;
                // do not eliminate inverters into COs
                if ( Abc_ObjIsCo(pObj) && Abc_NodeIsInv(pFanin) )
                    continue;
                // do not eliminate buffers connecting PIs and POs 
//                if ( Abc_ObjIsCo(pObj) && Abc_ObjIsCi(Abc_ObjFanin0(pFanin)) )
//                    continue;
                fChanges = 1;
                Counter++;
                // update function of the node
                if ( Abc_NodeIsInv(pFanin) )
                    pObj->pData = Hop_Compose( pMan, (Hop_Obj_t *)pObj->pData, Hop_Not(Hop_IthVar(pMan, k)), k );
                // update the fanin
                Abc_ObjPatchFanin( pObj, pFanin, Abc_ObjFanin0(pFanin) );
                if ( Abc_ObjFanoutNum(pFanin) == 0 )
                    Abc_NtkDeleteObj(pFanin);            
            }
        }
    }
    if ( fVerbose )
        printf( "Removed %d single input nodes.\n", Counter );
    return Counter;
}